

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicStdLayoutBaseCS::Run(BasicStdLayoutBaseCS *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  void *pvVar5;
  long lVar6;
  byte bVar7;
  size_t i;
  ulong uVar8;
  allocator_type local_1e9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> in_data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> out_d;
  stringstream ss;
  ostream local_1a0;
  
  in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar4 = std::operator<<(&local_1a0,"layout(local_size_x = 1) in;\n");
  iVar2 = (*(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
            _vptr_GLWrapper[9])(this,&in_data);
  std::operator<<(poVar4,(char *)CONCAT44(extraout_var,iVar2));
  std::__cxx11::stringbuf::str();
  GVar3 = ShaderStorageBufferObjectBase::CreateProgramCS
                    (&this->super_ShaderStorageBufferObjectBase,(string *)&out_d);
  this->m_program = GVar3;
  std::__cxx11::string::~string((string *)&out_d);
  this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
  bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                    (&this->super_ShaderStorageBufferObjectBase,this->m_program);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers(this_00,2,this->m_buffer);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_buffer[0]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,
               (long)in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,
               in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&out_d,(long)in_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)in_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,&local_1e9);
    glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_buffer[1]);
    glu::CallLogWrapper::glBufferData
              (this_00,0x90d2,
               (long)out_d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)out_d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                     .super__Vector_impl_data._M_start,
               out_d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e4);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
    pvVar5 = glu::CallLogWrapper::glMapBufferRange
                       (this_00,0x90d2,0,
                        (long)in_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)in_data.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,1);
    if (pvVar5 == (void *)0x0) {
      lVar6 = -1;
    }
    else {
      bVar7 = 1;
      for (uVar8 = 0;
          uVar8 < (ulong)((long)in_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)in_data.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start); uVar8 = uVar8 + 1) {
        if (in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] != *(uchar *)((long)pvVar5 + uVar8)) {
          bVar7 = 0;
          anon_unknown_0::Output("Byte at index %3d is %2x should be %2x.\n",uVar8 & 0xffffffff);
        }
      }
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x90d2);
      lVar6 = -(ulong)(~bVar7 & 1);
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&out_d.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  }
  else {
    lVar6 = -1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&in_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return lVar6;
}

Assistant:

virtual long Run()
	{
		std::vector<GLubyte> in_data;
		std::stringstream	ss;
		ss << "layout(local_size_x = 1) in;\n" << GetInput(in_data);

		m_program = CreateProgramCS(ss.str());
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(2, m_buffer);

		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer[0]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)in_data.size(), &in_data[0], GL_STATIC_DRAW);
		std::vector<GLubyte> out_d(in_data.size());
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_buffer[1]);
		glBufferData(GL_SHADER_STORAGE_BUFFER, (GLsizeiptr)out_d.size(), &out_d[0], GL_STATIC_DRAW);

		glUseProgram(m_program);
		glDispatchCompute(1, 1, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		GLubyte* out_data =
			(GLubyte*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, (GLsizeiptr)in_data.size(), GL_MAP_READ_BIT);
		if (!out_data)
			return ERROR;

		bool status = true;

		for (size_t i = 0; i < in_data.size(); ++i)
		{
			if (in_data[i] != out_data[i])
			{
				Output("Byte at index %3d is %2x should be %2x.\n", static_cast<int>(i), out_data[i], in_data[i]);
				status = false;
			}
		}
		glUnmapBuffer(GL_SHADER_STORAGE_BUFFER);
		if (!status)
			return ERROR;
		return NO_ERROR;
	}